

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_putstatic(ExecutionEngine *this)

{
  cp_info *pcVar1;
  CONSTANT_Long_info CVar2;
  Value value;
  ClassRuntime *pCVar3;
  bool bVar4;
  VMStack *this_00;
  Frame *this_01;
  cp_info **ppcVar5;
  u1 *puVar6;
  char *pcVar7;
  ClassFile *pCVar8;
  ostream *this_02;
  Frame *pFVar9;
  undefined1 *puVar10;
  Value VVar11;
  string local_1a8 [32];
  ulong local_188;
  anon_union_8_10_52016fac_for_data aStack_180;
  Value local_178;
  undefined8 uStack_168;
  Value topValue;
  string local_150 [8];
  string superClassName;
  string local_130 [32];
  ClassRuntime *local_110;
  ClassRuntime *classRuntime;
  MethodArea *methodArea;
  string local_f8 [8];
  string fieldDescriptor;
  allocator local_d1;
  string local_d0 [8];
  string fieldName;
  u2 local_ac;
  u2 uStack_aa;
  char cStack_a8;
  CONSTANT_NameAndType_info fieldNameAndType;
  cp_info nameAndTypeCP;
  allocator local_79;
  string local_78 [8];
  string className;
  u2 local_54;
  ushort uStack_52;
  char cStack_50;
  CONSTANT_Fieldref_info fieldRef;
  cp_info fieldCP;
  uint16_t fieldIndex;
  u1 byte2;
  u1 byte1;
  u1 *code;
  cp_info *constantPool;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  ppcVar5 = Frame::getConstantPool(this_01);
  pcVar1 = *ppcVar5;
  puVar6 = Frame::getCode(this_01,this_01->pc);
  fieldCP.info._14_2_ = CONCAT11(puVar6[1],puVar6[2]);
  CVar2 = pcVar1[(int)(CONCAT22(0,fieldCP.info._14_2_) - 1)].info.long_info;
  cStack_50 = (char)*(undefined8 *)(pcVar1 + (int)(CONCAT22(0,fieldCP.info._14_2_) - 1));
  if (cStack_50 != '\t') {
    __assert_fail("fieldCP.tag == CONSTANT_Fieldref",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xe25,"void ExecutionEngine::i_putstatic()");
  }
  local_54 = (u2)CVar2.high_bytes;
  pcVar7 = getFormattedConstant(pcVar1,local_54);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,pcVar7,&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  uStack_52 = CVar2.high_bytes._2_2_;
  CVar2 = pcVar1[(int)(uStack_52 - 1)].info.long_info;
  cStack_a8 = (char)*(undefined8 *)(pcVar1 + (int)(uStack_52 - 1));
  if (cStack_a8 != '\f') {
    __assert_fail("nameAndTypeCP.tag == CONSTANT_NameAndType",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xe2c,"void ExecutionEngine::i_putstatic()");
  }
  local_ac = (u2)CVar2.high_bytes;
  pcVar7 = getFormattedConstant(pcVar1,local_ac);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,pcVar7,&local_d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  uStack_aa = CVar2.high_bytes._2_2_;
  pcVar7 = getFormattedConstant(pcVar1,uStack_aa);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,pcVar7,(allocator *)((long)&methodArea + 7));
  std::allocator<char>::~allocator((allocator<char> *)((long)&methodArea + 7));
  classRuntime = (ClassRuntime *)MethodArea::getInstance();
  local_110 = MethodArea::loadClassNamed((MethodArea *)classRuntime,(string *)local_78);
  while (pCVar3 = local_110, local_110 != (ClassRuntime *)0x0) {
    std::__cxx11::string::string(local_130,local_d0);
    bVar4 = ClassRuntime::fieldExists(pCVar3,(string *)local_130);
    std::__cxx11::string::~string(local_130);
    if (bVar4) break;
    pCVar8 = ClassRuntime::getClassFile(local_110);
    if (pCVar8->super_class == 0) {
      local_110 = (ClassRuntime *)0x0;
    }
    else {
      pCVar8 = ClassRuntime::getClassFile(local_110);
      pcVar1 = pCVar8->constant_pool;
      pCVar8 = ClassRuntime::getClassFile(local_110);
      pcVar7 = getFormattedConstant(pcVar1,pCVar8->super_class);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,pcVar7,(allocator *)((long)&topValue.data + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&topValue.data + 7));
      local_110 = MethodArea::loadClassNamed((MethodArea *)classRuntime,(string *)local_150);
      std::__cxx11::string::~string(local_150);
    }
  }
  if (local_110 == (ClassRuntime *)0x0) {
    this_02 = std::operator<<((ostream *)&std::cerr,"NoSuchFieldError");
    std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  pFVar9 = VMStack::getTopFrame(this_00);
  VVar11.data.longValue = local_178.data.longValue;
  VVar11.printType = local_178.printType;
  VVar11.type = local_178.type;
  if (pFVar9 == this_01) {
    VVar11 = Frame::popTopOfOperandStack(this_01);
    topValue._0_8_ = VVar11.data;
    uStack_168._4_4_ = VVar11.type;
    uStack_168 = VVar11._0_8_;
    if ((uStack_168._4_4_ == DOUBLE) || (uStack_168._4_4_ == LONG)) {
      local_178 = Frame::popTopOfOperandStack(this_01);
    }
    else {
      puVar10 = (undefined1 *)std::__cxx11::string::operator[]((ulong)local_f8);
      switch(*puVar10) {
      case 0x42:
        uStack_168 = 0x100000001;
        break;
      case 0x43:
        uStack_168 = CONCAT44(2,(int)uStack_168);
        break;
      case 0x53:
        uStack_168 = CONCAT44(3,(int)uStack_168);
        break;
      case 0x5a:
        uStack_168 = uStack_168 & 0xffffffff;
      }
    }
    pCVar3 = local_110;
    local_188 = uStack_168;
    aStack_180 = (anon_union_8_10_52016fac_for_data)topValue._0_8_;
    std::__cxx11::string::string(local_1a8,local_d0);
    value.data.longValue = aStack_180.longValue;
    value.printType = (undefined4)local_188;
    value.type = local_188._4_4_;
    ClassRuntime::putValueIntoField(pCVar3,value,(string *)local_1a8);
    std::__cxx11::string::~string(local_1a8);
    this_01->pc = this_01->pc + 3;
    topValue.data.intValue = 0;
  }
  else {
    topValue.data.intValue = 1;
    local_178 = VVar11;
  }
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d0);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void ExecutionEngine::i_putstatic() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t fieldIndex = (byte1 << 8) | byte2;
    cp_info fieldCP = constantPool[fieldIndex-1];
    assert(fieldCP.tag == CONSTANT_Fieldref); // precisa ser um fieldRef

    CONSTANT_Fieldref_info fieldRef = fieldCP.info.fieldref_info;

    string className = getFormattedConstant(constantPool, fieldRef.class_index);

    cp_info nameAndTypeCP = constantPool[fieldRef.name_and_type_index-1];
    assert(nameAndTypeCP.tag == CONSTANT_NameAndType); // precisa ser um nameAndType

    CONSTANT_NameAndType_info fieldNameAndType = nameAndTypeCP.info.nameAndType_info;

    string fieldName = getFormattedConstant(constantPool, fieldNameAndType.name_index);
    string fieldDescriptor = getFormattedConstant(constantPool, fieldNameAndType.descriptor_index);

    MethodArea &methodArea = MethodArea::getInstance();
    ClassRuntime *classRuntime = methodArea.loadClassNamed(className);

    while (classRuntime != NULL) {
        if (classRuntime->fieldExists(fieldName) == false) {
            if (classRuntime->getClassFile()->super_class == 0) {
                classRuntime = NULL;
            } else {
                string superClassName = getFormattedConstant(classRuntime->getClassFile()->constant_pool, classRuntime->getClassFile()->super_class);
                classRuntime = methodArea.loadClassNamed(superClassName);
            }
        } else {
            break;
        }
    }

    if (classRuntime == NULL) {
        cerr << "NoSuchFieldError" << endl;
        exit(1);
    }

    // se a stack frame mudou, é porque teve <clinit> adicionado, então terminar a execução da instrução para eles serem executados.
    if (stackFrame.getTopFrame() != topFrame) return;
    
    Value topValue = topFrame->popTopOfOperandStack();
    if (topValue.type == ValueType::DOUBLE || topValue.type == ValueType::LONG) {
        topFrame->popTopOfOperandStack(); // removendo padding
    } else {
        switch (fieldDescriptor[0]) {
            case 'B':
                topValue.type = ValueType::BYTE;
                topValue.printType = ValueType::BYTE;
                break;
            case 'C':
                topValue.type = ValueType::CHAR;
                topValue.type = ValueType::CHAR;
                break;
            case 'S':
                topValue.type = ValueType::SHORT;
                topValue.type = ValueType::SHORT;
                break;
            case 'Z':
                topValue.type = ValueType::BOOLEAN;
                topValue.type = ValueType::BOOLEAN;
                break;
        }
    }

    classRuntime->putValueIntoField(topValue, fieldName);

    topFrame->pc += 3;
}